

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall
ON_Font::SetFromFontDescription(ON_Font *this,wchar_t *font_description,wchar_t *postscript_name)

{
  bool bVar1;
  wchar_t *pwVar2;
  bool rc;
  wchar_t *face_name;
  wchar_t *s;
  wchar_t *s1_2;
  wchar_t *s0_2;
  wchar_t *pwStack_b8;
  Stretch font_stretch;
  wchar_t *s1_1;
  wchar_t *s0_1;
  wchar_t *pwStack_a0;
  Style font_style;
  wchar_t *s1;
  wchar_t *s0;
  undefined4 local_88;
  int iStack_84;
  Weight font_weight;
  wchar_t x;
  int special_case_length;
  int i;
  int face_name_length;
  wchar_t *characteristics;
  ON_wString local_face_name;
  wchar_t *special_cases [2];
  ON_wString local_48;
  ON_wString local_postscript_name;
  ON_wString local_30;
  ON_wString local_font_description;
  wchar_t *postscript_name_local;
  wchar_t *font_description_local;
  ON_Font *this_local;
  
  local_font_description.m_s = postscript_name;
  ON_wString::ON_wString(&local_30,font_description);
  ON_wString::TrimLeftAndRight(&local_30,(wchar_t *)0x0);
  postscript_name_local = ON_wString::operator_cast_to_wchar_t_(&local_30);
  ON_wString::ON_wString(&local_48,local_font_description.m_s);
  ON_wString::TrimLeftAndRight(&local_48,(wchar_t *)0x0);
  local_font_description.m_s = ON_wString::operator_cast_to_wchar_t_(&local_48);
  if ((postscript_name_local == (wchar_t *)0x0) || (*postscript_name_local < L'!')) {
    postscript_name_local = ON_wString::operator_cast_to_wchar_t_(&local_48);
    ON_wString::operator=(&local_30,&local_48);
    if ((postscript_name_local == (wchar_t *)0x0) || (*postscript_name_local < L'!')) {
      this_local._7_1_ = false;
      goto LAB_0063138b;
    }
  }
  local_face_name.m_s = L"Times New Roman";
  ON_wString::ON_wString((ON_wString *)&characteristics,postscript_name_local);
  _i = (wchar_t *)0x0;
  special_case_length = ON_wString::Length((ON_wString *)&characteristics);
  x = L'\0';
  while (special_cases[(long)x + -1] != (wchar_t *)0x0) {
    iStack_84 = ON_wString::Length(special_cases[(long)x + -1]);
    if ((iStack_84 <= special_case_length) &&
       (((special_case_length <= iStack_84 ||
         (pwVar2 = ON_wString::operator[]((ON_wString *)&characteristics,iStack_84), *pwVar2 < L'!')
         ) && (bVar1 = ON_wString::EqualOrdinal
                                 (special_cases[(long)x + -1],iStack_84,postscript_name_local,
                                  iStack_84,true), bVar1)))) {
      _i = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&characteristics);
      _i = _i + iStack_84;
      break;
    }
    x = x + L'\x01';
  }
  if (_i == (wchar_t *)0x0) {
    _i = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&characteristics);
    _i = _i + 1;
  }
  local_88 = 1;
  s0._7_1_ = Default.m_font_weight;
  for (s1 = _i; *s1 != L'\0'; s1 = s1 + 1) {
    pwStack_a0 = s1;
    bVar1 = ParseWeight(&stack0xffffffffffffff60,(Weight *)((long)&s0 + 7));
    if (bVar1) goto LAB_00631056;
  }
  goto LAB_0063109e;
LAB_006310fd:
  while (s1_1 < pwStack_b8) {
    *s1_1 = L'\x01';
    s1_1 = s1_1 + 1;
  }
  goto LAB_00631145;
LAB_006311a4:
  while (s1_2 < s) {
    *s1_2 = L'\x01';
    s1_2 = s1_2 + 1;
  }
  goto LAB_006311ec;
LAB_00631239:
  while( true ) {
    bVar1 = false;
    if (L'\0' < *face_name) {
      bVar1 = *face_name < L'!';
    }
    if (!bVar1) break;
    face_name = face_name + 1;
  }
  goto LAB_0063129b;
LAB_00631056:
  while (s1 < pwStack_a0) {
    *s1 = L'\x01';
    s1 = s1 + 1;
  }
LAB_0063109e:
  s0_1._7_1_ = Default.m_font_style;
  for (s1_1 = _i; *s1_1 != L'\0'; s1_1 = s1_1 + 1) {
    pwStack_b8 = s1_1;
    bVar1 = ParseStyle(&stack0xffffffffffffff48,(Style *)((long)&s0_1 + 7));
    if (bVar1) goto LAB_006310fd;
  }
LAB_00631145:
  s0_2._7_1_ = Default.m_font_stretch;
  for (s1_2 = _i; *s1_2 != L'\0'; s1_2 = s1_2 + 1) {
    s = s1_2;
    bVar1 = ParseStretch(&s,(Stretch *)((long)&s0_2 + 7));
    if (bVar1) goto LAB_006311a4;
  }
LAB_006311ec:
  special_case_length = 0;
  for (face_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&characteristics);
      *face_name != L'\0'; face_name = face_name + 1) {
    if (*face_name < L' ') goto LAB_00631239;
    special_case_length = special_case_length + 1;
  }
LAB_0063129b:
  ON_wString::SetLength((ON_wString *)&characteristics,(long)special_case_length);
  ON_wString::TrimLeftAndRight((ON_wString *)&characteristics,(wchar_t *)0x0);
  pwVar2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&characteristics);
  this_local._7_1_ =
       SetFontCharacteristics(this,pwVar2,s0._7_1_,s0_1._7_1_,s0_2._7_1_,false,false,1.6,1);
  if (this_local._7_1_) {
    ON_wString::operator=(&this->m_loc_postscript_name,&local_48);
    ON_wString::operator=(&this->m_en_postscript_name,&this->m_loc_postscript_name);
  }
  ON_wString::~ON_wString((ON_wString *)&characteristics);
LAB_0063138b:
  ON_wString::~ON_wString(&local_48);
  ON_wString::~ON_wString(&local_30);
  return this_local._7_1_;
}

Assistant:

bool ON_Font::SetFromFontDescription(
  const wchar_t* font_description,
  const wchar_t* postscript_name
  )
{
  ON_wString local_font_description(font_description);
  local_font_description.TrimLeftAndRight();
  font_description = static_cast<const wchar_t*>(local_font_description);

  ON_wString local_postscript_name(postscript_name);
  local_postscript_name.TrimLeftAndRight();
  postscript_name = static_cast<const wchar_t*>(local_postscript_name);

  if (nullptr == font_description || font_description[0] <= ON_wString::Space)
  {
    font_description = local_postscript_name;
    local_font_description = local_postscript_name;
    if (nullptr == font_description || font_description[0] <= ON_wString::Space)
      return false;
  }

  // As names are discovered that do not work in the code below,
  // add a special case here.  These are typically fonts that have
  // words like Upright, Italic, Oblique, Regular, Semi, Demi, Extra, Ultra, Medium
  // Black, Heavy, ... as part of the face name and those words must not
  // be parsed as possible weight, style or stretch characteristics applied
  // to a root face name.
  const wchar_t* special_cases[] = {
    // Apple's "Times New Roman" and "Times New Roman Bold Italic" is an example of why
    // special cases are required.  The face name is "Times New Roman" and "Roman" no
    // longer indicates an upright style.
    // However, Apple's "Avenir Roman" and "Avenir Oblique" fonts provide an example
    // where "Roman" is style and "Avenir" is a face name.  The default parsing
    // handles Avenir and any other font names that are using Roman as a style.
    L"Times New Roman", 

    // Put new special case names above this nullptr which terminates the special_cases[] list.
    nullptr
  };

  // NOTE WELL: 
  //  It is important that local_face_name be created from a pointer
  //  so that it's string buffer is not shared with other ON_wStrings.
  //  wchar_t values in local_face_name are modifed via const_cast<> below.
  ON_wString local_face_name = static_cast<const wchar_t*>(font_description);
  const wchar_t* characteristics = nullptr;
  int face_name_length = local_face_name.Length();
  for (int i = 0; nullptr != special_cases[i]; i++)
  {
    const int special_case_length = ON_wString::Length(special_cases[i]);
    if (special_case_length > face_name_length)
      continue;
    
    if (special_case_length < face_name_length && local_face_name[special_case_length] > ON_wString::Space )
      continue;
    
    if (false == ON_wString::EqualOrdinal(special_cases[i], special_case_length, font_description, special_case_length, true))
      continue;

    characteristics = static_cast<const wchar_t*>(local_face_name) + special_case_length;
    break;
  }

  if (nullptr == characteristics)
    characteristics = static_cast<const wchar_t*>(local_face_name) + 1;

  const wchar_t x = (wchar_t)1;

  ON_Font::Weight font_weight = ON_Font::Default.m_font_weight;
  for (wchar_t* s0 = const_cast<wchar_t*>(characteristics); 0 != *s0; s0++)
  {
    const wchar_t* s1 = s0;
    if (ParseWeight(s1, font_weight))
    {
      while ( s0 < s1 )
        *s0++ = x; // NOTE - modifies local_face_name content
      break;
    }
  }

  ON_Font::Style font_style = ON_Font::Default.m_font_style;
  for (wchar_t* s0 = const_cast<wchar_t*>(characteristics); 0 != *s0; s0++)
  {
    const wchar_t* s1 = s0;
    if (ParseStyle(s1, font_style))
    {
      while ( s0 < s1 )
        *s0++ = x; // NOTE - modifies local_face_name content
      break;
    }
  }

  ON_Font::Stretch font_stretch = ON_Font::Default.m_font_stretch;
  for (wchar_t* s0 = const_cast<wchar_t*>(characteristics); 0 != *s0; s0++)
  {
    const wchar_t* s1 = s0;
    if (ParseStretch(s1, font_stretch))
    {
      while ( s0 < s1 )
        *s0++ = x; // NOTE - modifies local_face_name content
      break;
    }
  }

  face_name_length = 0;
  for (const wchar_t* s = static_cast<const wchar_t*>(local_face_name); 0 != *s; s++)
  {
    if (*s >= ON_wString::Space)
      face_name_length++;
    else
    {
      while (*s > 0 && *s <= ON_wString::Space)
        s++;
      break;
    }
  }
  local_face_name.SetLength(face_name_length);
  local_face_name.TrimLeftAndRight();
  const wchar_t* face_name = static_cast<const wchar_t*>(local_face_name);

  bool rc = SetFontCharacteristics(
    face_name,
    font_weight,
    font_style,
    font_stretch,
    false,
    false,
    ON_FontMetrics::DefaultLineFeedRatio,
    ON_Font::WindowsConstants::logfont_default_charset
    );

  if (rc)
  {
    m_loc_postscript_name = local_postscript_name;
    m_en_postscript_name = m_loc_postscript_name;
  }  

  return rc;
}